

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O0

void __thiscall
Properties_ToleranceSphere_Test::~Properties_ToleranceSphere_Test
          (Properties_ToleranceSphere_Test *this)

{
  Properties_ToleranceSphere_Test *this_local;
  
  ~Properties_ToleranceSphere_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Properties, ToleranceSphere) {
  const int n = 1000;
  Manifold sphere = Manifold::Sphere(1, 4 * n);
  EXPECT_EQ(sphere.NumTri(), 8 * n * n);

  Manifold sphere2 = sphere.SetTolerance(0.01);
  EXPECT_LT(sphere2.NumTri(), 2500);
  EXPECT_EQ(sphere2.Genus(), 0);
  EXPECT_NEAR(sphere.Volume(), sphere2.Volume(), 0.05);
  EXPECT_NEAR(sphere.SurfaceArea(), sphere2.SurfaceArea(), 0.06);
#ifdef MANIFOLD_EXPORT
  if (options.exportModels) ExportMesh("sphere.glb", sphere2.GetMeshGL(), {});
#endif
}